

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O2

void (anonymous_namespace)::
     TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
               (Emulator *e,char *name,CgbSwatchArg args,CgbSwatchArg args_1,CgbSwatchArg args_2,
               CgbSwatchArg args_3)

{
  ImU32 IVar1;
  CgbSwatchArg CVar2;
  Emulator *e_00;
  ImDrawList *pIVar3;
  int color_index;
  float fVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  PaletteRGBA PVar5;
  PaletteRGBA pal_rgba;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  Emulator *local_a0;
  undefined1 local_98 [8];
  ImVec2 local_90;
  RGBA local_88 [4];
  RGBA local_78 [4];
  undefined1 local_68 [16];
  ImVec2 p;
  ImVec2 p_1;
  ImVec2 p_2;
  char buf [15];
  
  CVar2 = args_2;
  local_d8._8_8_ = local_d8._0_8_;
  uStack_b0 = local_b8;
  uStack_c0 = local_c8;
  local_c8 = (undefined1  [8])args_1._0_8_;
  local_a0 = e;
  snprintf(buf,0xf,"[%s]",name);
  ImGui::Text("   %8s:   ",buf);
  ImGui::SameLine(0.0,-1.0);
  local_b8._0_4_ = args_2.type;
  local_b8._4_4_ = args_2.palette_index;
  local_98._0_4_ = args_3.type;
  local_98._4_4_ = args_3.palette_index;
  local_88 = (RGBA  [4])emulator_get_cgb_palette_rgba(e,args.type,args.palette_index);
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)(uint)args.color_index);
  IVar1 = local_88[0xe4U >> ((char)args.color_index * '\x02' & 0x1fU) & 3];
  fVar4 = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  p = ImGui::GetCursorScreenPos();
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._0_4_ = p.x;
  local_68._4_4_ = p.y;
  local_68._12_4_ = extraout_XMM0_Dd;
  pIVar3 = ImGui::GetWindowDrawList();
  local_d8._4_4_ = fVar4 + (float)local_68._4_4_;
  local_d8._0_4_ = fVar4 + (float)local_68._0_4_;
  ImDrawList::AddRectFilled(pIVar3,&p,(ImVec2 *)local_d8,IVar1,0.0,0);
  local_d8._4_4_ = fVar4;
  local_d8._0_4_ = fVar4;
  ImGui::Dummy((ImVec2 *)local_d8);
  e_00 = local_a0;
  local_78 = (RGBA  [4])emulator_get_cgb_palette_rgba(local_a0,local_c8._0_4_,local_c8._4_4_);
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)(uint)args_1.color_index);
  IVar1 = local_78[0xe4U >> ((char)args_1.color_index * '\x02' & 0x1fU) & 3];
  fVar4 = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  p_1 = ImGui::GetCursorScreenPos();
  unique0x100001c4 = extraout_XMM0_Dc_00;
  local_c8._0_4_ = p_1.x;
  local_c8._4_4_ = p_1.y;
  unique0x100001c8 = extraout_XMM0_Dd_00;
  pIVar3 = ImGui::GetWindowDrawList();
  local_d8._4_4_ = fVar4 + (float)local_c8._4_4_;
  local_d8._0_4_ = fVar4 + (float)local_c8._0_4_;
  ImDrawList::AddRectFilled(pIVar3,&p_1,(ImVec2 *)local_d8,IVar1,0.0,0);
  local_d8._4_4_ = fVar4;
  local_d8._0_4_ = fVar4;
  ImGui::Dummy((ImVec2 *)local_d8);
  local_d8 = (undefined1  [16])emulator_get_cgb_palette_rgba(e_00,local_b8._0_4_,local_b8._4_4_);
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)(uint)args_2.color_index);
  IVar1 = *(ImU32 *)(local_d8 + (ulong)(0xe4U >> ((char)CVar2.color_index * '\x02' & 0x1fU) & 3) * 4
                    );
  fVar4 = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  p_2 = ImGui::GetCursorScreenPos();
  unique0x1000020c = extraout_XMM0_Dc_01;
  local_b8._0_4_ = p_2.x;
  local_b8._4_4_ = p_2.y;
  unique0x10000210 = extraout_XMM0_Dd_01;
  pIVar3 = ImGui::GetWindowDrawList();
  local_90.y = fVar4 + (float)local_b8._4_4_;
  local_90.x = fVar4 + (float)local_b8._0_4_;
  color_index = 0;
  ImDrawList::AddRectFilled(pIVar3,&p_2,&local_90,IVar1,0.0,0);
  local_90.y = fVar4;
  local_90.x = fVar4;
  ImGui::Dummy(&local_90);
  PVar5 = emulator_get_cgb_palette_rgba(e_00,local_98._0_4_,local_98._4_4_);
  pal_rgba.color._0_8_ = PVar5.color._8_8_;
  pal_rgba.color[2] = args_3.color_index;
  pal_rgba.color[3] = 0;
  anon_unknown.dwarf_a07a8::ColorSwatchTextRegBits<>
            ((Emulator *)0xe4,(u8)PVar5.color[0],pal_rgba,color_index);
  return;
}

Assistant:

void TextCgbPal(Emulator* e, const char* name, Args... args) {
  const ImVec4 kRegColor(1.f, 0.75f, 0.3f, 1.f);

  char buf[15];
  u8 v = 0xE4; // Always use normal order.
  snprintf(buf, sizeof(buf), "[%s]", name);
  ImGui::Text("   %8s:   ", buf);
  ImGui::SameLine();
  TextRegBits(e, v, args...);
}